

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles3::Functional::ShaderMatrixCase::genGLSLMatToVec3Reduction_abi_cxx11_
          (string *__return_storage_ptr__,ShaderMatrixCase *this,DataType *matType,char *varName)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  ostringstream op;
  undefined1 auStack_198 [8];
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  switch(*matType) {
  case TYPE_FLOAT:
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,", ",2);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,", ",2);
  case TYPE_FLOAT_VEC3:
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    pcVar3 = glcts::fixed_sample_locations_values + 1;
    lVar2 = 0;
    break;
  case TYPE_FLOAT_VEC2:
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".x, ",4);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".y, ",4);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    lVar2 = 2;
    pcVar3 = ".x";
    break;
  case TYPE_FLOAT_VEC4:
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".x, ",4);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".y, ",4);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".z+",3);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    lVar2 = 2;
    pcVar3 = ".w";
    break;
  case TYPE_FLOAT_MAT2:
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0][0], ",8);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[1][0], ",8);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0][1]+",7);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    lVar2 = 6;
    pcVar3 = "[1][1]";
    break;
  case TYPE_FLOAT_MAT2X3:
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0] + ",6);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    lVar2 = 3;
    pcVar3 = "[1]";
    break;
  case TYPE_FLOAT_MAT2X4:
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0].xyz + ",10);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    lVar2 = 7;
    pcVar3 = "[1].yzw";
    break;
  case TYPE_FLOAT_MAT3X2:
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0][0]+",7);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0][1], ",8);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[1][0]+",7);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[1][1], ",8);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[2][0]+",7);
    goto LAB_010b59b6;
  case TYPE_FLOAT_MAT3:
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0] + ",6);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[1] + ",6);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    lVar2 = 3;
    pcVar3 = "[2]";
    break;
  case TYPE_FLOAT_MAT3X4:
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0].xyz + ",10);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[1].yzw + ",10);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    lVar2 = 7;
    pcVar3 = "[2].zwx";
    break;
  case TYPE_FLOAT_MAT4X2:
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0][0]+",7);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0][1]+",7);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[3][0], ",8);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[1][0]+",7);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[1][1]+",7);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[3][1], ",8);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[2][0]+",7);
LAB_010b59b6:
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    lVar2 = 6;
    pcVar3 = "[2][1]";
    break;
  case TYPE_FLOAT_MAT4X3:
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0] + ",6);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[1] + ",6);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[2] + ",6);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    lVar2 = 3;
    pcVar3 = "[3]";
    break;
  case TYPE_FLOAT_MAT4:
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[0].xyz+",8);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[1].yzw+",8);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[2].zwx+",8);
    if (varName == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(_func_int **)(local_190._0_8_ + -0x18) + 8);
    }
    else {
      sVar1 = strlen(varName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,varName,sVar1);
    }
    lVar2 = 7;
    pcVar3 = "[3].wxy";
    break;
  default:
    goto switchD_010b4ae7_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar3,lVar2);
switchD_010b4ae7_default:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string ShaderMatrixCase::genGLSLMatToVec3Reduction (const glu::DataType& matType, const char* varName)
{
	std::ostringstream op;

	switch (matType)
	{
		case TYPE_FLOAT:		op << varName << ", "			<< varName << ", "			<< varName << "";																																			break;
		case TYPE_FLOAT_VEC2:	op << varName << ".x, "			<< varName << ".y, "		<< varName << ".x";																																			break;
		case TYPE_FLOAT_VEC3:	op << varName << "";																																																	break;
		case TYPE_FLOAT_VEC4:	op << varName << ".x, "			<< varName << ".y, "		<< varName << ".z+"			<< varName << ".w";																												break;
		case TYPE_FLOAT_MAT2:	op << varName << "[0][0], "		<< varName << "[1][0], "	<< varName << "[0][1]+"		<< varName << "[1][1]";																											break;
		case TYPE_FLOAT_MAT2X3:	op << varName << "[0] + "		<< varName << "[1]";																																									break;
		case TYPE_FLOAT_MAT2X4:	op << varName << "[0].xyz + "	<< varName << "[1].yzw";																																								break;
		case TYPE_FLOAT_MAT3X2:	op << varName << "[0][0]+"		<< varName << "[0][1], "	<< varName << "[1][0]+"		<< varName << "[1][1], "	<< varName << "[2][0]+" << varName << "[2][1]";														break;
		case TYPE_FLOAT_MAT3:	op << varName << "[0] + "		<< varName << "[1] + "		<< varName << "[2]";																																		break;
		case TYPE_FLOAT_MAT3X4:	op << varName << "[0].xyz + "	<< varName << "[1].yzw + "	<< varName << "[2].zwx";																																	break;
		case TYPE_FLOAT_MAT4X2:	op << varName << "[0][0]+"		<< varName << "[0][1]+"		<< varName << "[3][0], "	<< varName << "[1][0]+"		<< varName << "[1][1]+" << varName << "[3][1], " << varName << "[2][0]+" << varName << "[2][1]";	break;
		case TYPE_FLOAT_MAT4X3:	op << varName << "[0] + "		<< varName << "[1] + "		<< varName << "[2] + "		<< varName << "[3]";																											break;
		case TYPE_FLOAT_MAT4:	op << varName << "[0].xyz+"		<< varName << "[1].yzw+"	<< varName << "[2].zwx+"	<< varName << "[3].wxy";																										break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	return op.str();
}